

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool google::ParseUnqualifiedName(State *state)

{
  bool bVar1;
  bool local_12;
  bool local_11;
  State *state_local;
  
  bVar1 = ParseOperatorName(state);
  local_11 = true;
  if (!bVar1) {
    bVar1 = ParseCtorDtorName(state);
    local_11 = true;
    if (!bVar1) {
      bVar1 = ParseSourceName(state);
      if (bVar1) {
        bVar1 = ParseAbiTags(state);
        bVar1 = Optional(bVar1);
        if (bVar1) {
          return true;
        }
      }
      bVar1 = ParseLocalSourceName(state);
      local_12 = false;
      if (bVar1) {
        bVar1 = ParseAbiTags(state);
        local_12 = Optional(bVar1);
      }
      local_11 = local_12;
    }
  }
  return local_11;
}

Assistant:

static bool ParseUnqualifiedName(State *state) {
  return (ParseOperatorName(state) ||
          ParseCtorDtorName(state) ||
          (ParseSourceName(state) && Optional(ParseAbiTags(state))) ||
          (ParseLocalSourceName(state) && Optional(ParseAbiTags(state))));
}